

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O1

string * __thiscall
ser::FieldsTable::ToString_abi_cxx11_(string *__return_storage_ptr__,FieldsTable *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  ostringstream ss;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FieldsTable [\n",0xe);
  p_Var2 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      DataFieldInfo::ToString_abi_cxx11_(&local_1c8,(DataFieldInfo *)(p_Var2 + 2));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::ToString() const
{
    std::ostringstream ss;
    ss << "FieldsTable [\n";
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << "    " << iter->second.ToString() << "\n";
    }
    ss << "]\n";
    return ss.str();
}